

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O3

void writeInFile(vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *image,int w,int h,string *name)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  ostream *poVar4;
  pointer pVVar5;
  long *plVar6;
  size_t j;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  ofstream ofs;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::operator+(&local_250,"../images/out",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_268 = *plVar6;
    lStack_260 = plVar3[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar6;
    local_278 = (long *)*plVar3;
  }
  local_270 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_278);
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n255\n",5);
  if (h * w != 0) {
    local_258 = (long)(h * w);
    lVar8 = 0;
    do {
      pVVar5 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar9 = pVVar5[lVar8].z;
      uVar1 = pVVar5[lVar8].x;
      uVar2 = pVVar5[lVar8].y;
      fVar10 = fVar9;
      if (fVar9 <= (float)uVar2) {
        fVar10 = (float)uVar2;
      }
      if (fVar10 <= (float)uVar1) {
        fVar10 = (float)uVar1;
      }
      if (1.0 < fVar10) {
        pVVar5 = pVVar5 + lVar8;
        fVar10 = 1.0 / fVar10;
        pVVar5->x = fVar10 * (float)uVar1;
        pVVar5->y = fVar10 * (float)uVar2;
        pVVar5->z = fVar9 * fVar10;
      }
      lVar7 = 0;
      do {
        pVVar5 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar8;
        if (lVar7 != 0) {
          if (lVar7 == 1) {
            pVVar5 = (pointer)&pVVar5->y;
          }
          else {
            pVVar5 = (pointer)&pVVar5->z;
          }
        }
        fVar9 = pVVar5->x;
        if (1.0 <= fVar9) {
          fVar9 = 1.0;
        }
        if (fVar9 <= 0.0) {
          fVar9 = 0.0;
        }
        local_278 = (long *)CONCAT71(local_278._1_7_,(char)(int)(fVar9 * 255.0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)&local_278,1);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar8 = lVar8 + 1;
    } while (lVar8 != local_258);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeInFile(std::vector<Vec3f> &image, int w, int h, std::string name){
    std::ofstream ofs;
    ofs.open("../images/out" + name + ".ppm", std::ios::binary);
    ofs << "P6\n" << w << " " << h << "\n255\n";
    for(size_t i = 0; i < h * w; i++){
        Vec3f &c = image[i];
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max>1) c = c*(1.f/max);
        for (size_t j = 0; j<3; j++) {
            ofs << (char)(255 * std::max(0.f, std::min(1.f, image[i][j])));
        }
    }
    ofs.close();
}